

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

SyHashEntry * SyHashGet(SyHash *pHash,void *pKey,sxu32 nKeyLen)

{
  SyHashEntry_Pr *pEntry;
  sxu32 nKeyLen_local;
  void *pKey_local;
  SyHash *pHash_local;
  
  if ((pHash->nEntry == 0) || (nKeyLen == 0)) {
    pHash_local = (SyHash *)0x0;
  }
  else {
    pHash_local = (SyHash *)HashGetEntry(pHash,pKey,nKeyLen);
    if ((SyHashEntry_Pr *)pHash_local == (SyHashEntry_Pr *)0x0) {
      pHash_local = (SyHash *)0x0;
    }
  }
  return (SyHashEntry *)pHash_local;
}

Assistant:

JX9_PRIVATE SyHashEntry * SyHashGet(SyHash *pHash, const void *pKey, sxu32 nKeyLen)
{
	SyHashEntry_Pr *pEntry;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) ){
		return 0;
	}
#endif
	if( pHash->nEntry < 1 || nKeyLen < 1 ){
		/* Don't bother hashing, return immediately */
		return 0;
	}
	pEntry = HashGetEntry(&(*pHash), pKey, nKeyLen);
	if( pEntry == 0 ){
		return 0;
	}
	return (SyHashEntry *)pEntry;
}